

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommands.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  App *pAVar2;
  Option *pOVar3;
  ostream *poVar4;
  size_t sVar5;
  reference ppAVar6;
  string *psVar7;
  App *subcom;
  iterator __end1;
  iterator __begin1;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range1;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  undefined4 local_5ac;
  ParseError *e;
  string local_598;
  Option *local_578;
  Option *s;
  string local_568;
  allocator local_541;
  string local_540;
  undefined1 local_520 [8];
  string file;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  App *local_4b0;
  App *stop;
  string local_4a0;
  allocator local_479;
  string local_478;
  App *local_458;
  App *start;
  string local_448;
  allocator local_421;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"K3Pi goofit fitter",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
  CLI::App::App((App *)local_378,&local_398,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"--help-all",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"Expand all help",&local_421);
  CLI::App::set_help_all_flag((App *)local_378,&local_3f8,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"--random",(allocator *)((long)&start + 7));
  CLI::App::add_flag<const_char[17],_(CLI::detail::enabler)0>
            ((App *)local_378,&local_448,(char (*) [17])"Some random flag");
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"start",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4a0,"A great subcommand",(allocator *)((long)&stop + 7));
  pAVar2 = CLI::App::add_subcommand((App *)local_378,&local_478,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stop + 7));
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  local_458 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"stop",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4f8,"Do you really want to stop?",
             (allocator *)(file.field_2._M_local_buf + 0xf));
  pAVar2 = CLI::App::add_subcommand((App *)local_378,&local_4d0,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)(file.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  local_4b0 = pAVar2;
  CLI::App::require_subcommand((App *)local_378);
  std::__cxx11::string::string((string *)local_520);
  pAVar2 = local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"-f,--file",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"File name",(allocator *)((long)&s + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_540,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
             &local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  pAVar2 = local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,"-c,--count",(allocator *)((long)&e + 7));
  pOVar3 = CLI::App::add_flag<const_char[8],_(CLI::detail::enabler)0>
                     (pAVar2,&local_598,(char (*) [8])"Counter");
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_578 = pOVar3;
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  poVar4 = std::operator<<((ostream *)&std::cout,"Working on --file from start: ");
  poVar4 = std::operator<<(poVar4,(string *)local_520);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Working on --count from stop: ");
  sVar5 = CLI::Option::count(local_578);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  poVar4 = std::operator<<(poVar4,", direct count: ");
  pAVar2 = local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,"--count",&local_5d1);
  sVar5 = CLI::App::count(pAVar2,&local_5d0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  poVar4 = std::operator<<((ostream *)&std::cout,"Count of --random flag: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f8,"--random",(allocator *)((long)&__range1 + 7));
  sVar5 = CLI::App::count((App *)local_378,&local_5f8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1,(App *)local_378);
  __end1 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin
                     ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1);
  subcom = (App *)CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end
                            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                                *)&subcom);
    if (!bVar1) break;
    ppAVar6 = __gnu_cxx::
              __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              ::operator*(&__end1);
    pAVar2 = *ppAVar6;
    poVar4 = std::operator<<((ostream *)&std::cout,"Subcommand: ");
    psVar7 = CLI::App::get_name_abi_cxx11_(pAVar2);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    std::operator<<(poVar4,'\n');
    __gnu_cxx::__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
    ::operator++(&__end1);
  }
  local_5ac = 2;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1);
  local_5ac = 1;
  std::__cxx11::string::~string((string *)local_520);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");
    app.set_help_all_flag("--help-all", "Expand all help");
    app.add_flag("--random", "Some random flag");
    CLI::App *start = app.add_subcommand("start", "A great subcommand");
    CLI::App *stop = app.add_subcommand("stop", "Do you really want to stop?");
    app.require_subcommand();  // 1 or more

    std::string file;
    start->add_option("-f,--file", file, "File name");

    CLI::Option *s = stop->add_flag("-c,--count", "Counter");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on --file from start: " << file << '\n';
    std::cout << "Working on --count from stop: " << s->count() << ", direct count: " << stop->count("--count") << '\n';
    std::cout << "Count of --random flag: " << app.count("--random") << '\n';
    for(auto *subcom : app.get_subcommands())
        std::cout << "Subcommand: " << subcom->get_name() << '\n';

    return 0;
}